

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MipsParser.cpp
# Opt level: O0

bool __thiscall MipsParser::parseVcstParameter(MipsParser *this,Parser *parser,int *result)

{
  TokenValueSequence values;
  TokenSequence tokens;
  TokenValueSequence values_00;
  TokenSequence tokens_00;
  TokenValueSequence values_01;
  TokenSequence tokens_01;
  TokenValueSequence values_02;
  TokenSequence tokens_02;
  TokenValueSequence values_03;
  TokenSequence tokens_03;
  TokenValueSequence values_04;
  TokenSequence tokens_04;
  TokenValueSequence values_05;
  TokenSequence tokens_05;
  TokenValueSequence values_06;
  TokenSequence tokens_06;
  TokenValueSequence values_07;
  TokenSequence tokens_07;
  TokenValueSequence values_08;
  TokenSequence tokens_08;
  TokenValueSequence values_09;
  TokenSequence tokens_09;
  TokenValueSequence values_10;
  TokenSequence tokens_10;
  TokenValueSequence values_11;
  TokenSequence tokens_11;
  TokenValueSequence values_12;
  TokenSequence tokens_12;
  TokenValueSequence values_13;
  TokenSequence tokens_13;
  TokenValueSequence values_14;
  TokenSequence tokens_14;
  TokenValueSequence values_15;
  TokenSequence tokens_15;
  TokenValueSequence values_16;
  TokenSequence tokens_16;
  TokenValueSequence values_17;
  TokenSequence tokens_17;
  TokenValueSequence values_18;
  TokenSequence tokens_18;
  bool bVar1;
  int iVar2;
  size_t sVar3;
  TokenSequenceValue local_660;
  TokenSequenceValue TStack_650;
  TokenSequenceValue TStack_640;
  iterator local_630;
  undefined8 local_628;
  TokenType local_620 [6];
  iterator local_608;
  size_type local_600;
  TokenSequenceValue local_5f8;
  TokenSequenceValue TStack_5e8;
  iterator local_5d8;
  undefined8 local_5d0;
  TokenType local_5c8 [4];
  iterator local_5b8;
  size_type local_5b0;
  TokenSequenceValue local_5a8;
  TokenSequenceValue TStack_598;
  iterator local_588;
  undefined8 local_580;
  TokenType local_578 [4];
  iterator local_568;
  size_type local_560;
  TokenSequenceValue local_558;
  TokenSequenceValue TStack_548;
  iterator local_538;
  undefined8 local_530;
  TokenType local_524 [3];
  iterator local_518;
  size_type local_510;
  TokenSequenceValue local_508;
  TokenSequenceValue TStack_4f8;
  iterator local_4e8;
  undefined8 local_4e0;
  TokenType local_4d8 [4];
  iterator local_4c8;
  size_type local_4c0;
  TokenSequenceValue local_4b8;
  TokenSequenceValue TStack_4a8;
  iterator local_498;
  undefined8 local_490;
  TokenType local_488 [4];
  iterator local_478;
  size_type local_470;
  TokenSequenceValue local_468;
  TokenSequenceValue TStack_458;
  iterator local_448;
  undefined8 local_440;
  TokenType local_438 [4];
  iterator local_428;
  size_type local_420;
  TokenSequenceValue local_418;
  TokenSequenceValue TStack_408;
  iterator local_3f8;
  undefined8 local_3f0;
  TokenType local_3e8 [4];
  iterator local_3d8;
  size_type local_3d0;
  TokenSequenceValue local_3c8;
  iterator local_3b8;
  undefined8 local_3b0;
  TokenType local_3a4;
  iterator local_3a0;
  size_type local_398;
  TokenSequenceValue local_390;
  iterator local_380;
  undefined8 local_378;
  TokenType local_36c;
  iterator local_368;
  size_type local_360;
  TokenSequenceValue local_358;
  TokenSequenceValue TStack_348;
  iterator local_338;
  undefined8 local_330;
  TokenType local_324 [3];
  iterator local_318;
  size_type local_310;
  TokenSequenceValue local_308;
  TokenSequenceValue TStack_2f8;
  iterator local_2e8;
  undefined8 local_2e0;
  TokenType local_2d4 [3];
  iterator local_2c8;
  size_type local_2c0;
  TokenSequenceValue local_2b8;
  TokenSequenceValue TStack_2a8;
  iterator local_298;
  undefined8 local_290;
  TokenType local_284 [3];
  iterator local_278;
  size_type local_270;
  TokenSequenceValue local_268;
  TokenSequenceValue TStack_258;
  iterator local_248;
  undefined8 local_240;
  TokenType local_234 [3];
  iterator local_228;
  size_type local_220;
  TokenSequenceValue local_218;
  TokenSequenceValue TStack_208;
  iterator local_1f8;
  undefined8 local_1f0;
  TokenType local_1e4 [3];
  iterator local_1d8;
  size_type local_1d0;
  TokenSequenceValue local_1c8;
  TokenSequenceValue TStack_1b8;
  TokenSequenceValue TStack_1a8;
  iterator local_198;
  undefined8 local_190;
  TokenType local_188 [6];
  iterator local_170;
  size_type local_168;
  TokenSequenceValue local_160;
  TokenSequenceValue TStack_150;
  iterator local_140;
  undefined8 local_138;
  TokenType local_130 [4];
  iterator local_120;
  size_type local_118;
  TokenSequenceValue local_110;
  TokenSequenceValue TStack_100;
  TokenSequenceValue TStack_f0;
  iterator local_e0;
  undefined8 local_d8;
  TokenType local_d0 [6];
  iterator local_b8;
  size_type local_b0;
  TokenSequenceValue local_a8;
  TokenSequenceValue TStack_98;
  iterator local_88;
  undefined8 local_80;
  TokenType local_78 [4];
  iterator local_68;
  size_type local_60;
  TokenSequenceValue local_58;
  iterator local_48;
  undefined8 local_40;
  TokenType local_34;
  iterator local_30;
  size_type local_28;
  int *local_20;
  int *result_local;
  Parser *parser_local;
  MipsParser *this_local;
  
  local_20 = result;
  result_local = (int *)parser;
  parser_local = (Parser *)this;
  if (parseVcstParameter(Parser&,int&)::sequenceParser == '\0') {
    iVar2 = __cxa_guard_acquire(&parseVcstParameter(Parser&,int&)::sequenceParser);
    if (iVar2 != 0) {
      TokenSequenceParser::TokenSequenceParser(&parseVcstParameter::sequenceParser);
      __cxa_atexit(TokenSequenceParser::~TokenSequenceParser,&parseVcstParameter::sequenceParser,
                   &__dso_handle);
      __cxa_guard_release(&parseVcstParameter(Parser&,int&)::sequenceParser);
    }
  }
  sVar3 = TokenSequenceParser::getEntryCount(&parseVcstParameter::sequenceParser);
  if (sVar3 == 0) {
    local_34 = Identifier;
    local_30 = &local_34;
    local_28 = 1;
    TokenSequenceValue::TokenSequenceValue(&local_58,"maxfloat");
    local_48 = &local_58;
    local_40 = 1;
    tokens_18._M_len = local_28;
    tokens_18._M_array = local_30;
    values_18._M_len = 1;
    values_18._M_array = local_48;
    TokenSequenceParser::addEntry(&parseVcstParameter::sequenceParser,1,tokens_18,values_18);
    local_78[0] = Identifier;
    local_78[1] = 5;
    local_78[2] = 2;
    local_78[3] = 6;
    local_68 = local_78;
    local_60 = 4;
    TokenSequenceValue::TokenSequenceValue(&local_a8,"sqrt");
    TokenSequenceValue::TokenSequenceValue(&TStack_98,2);
    local_88 = &local_a8;
    local_80 = 2;
    tokens_17._M_len = local_60;
    tokens_17._M_array = local_68;
    values_17._M_len = 2;
    values_17._M_array = local_88;
    TokenSequenceParser::addEntry(&parseVcstParameter::sequenceParser,2,tokens_17,values_17);
    local_d0[0] = Identifier;
    local_d0[1] = LParen;
    local_d0[2] = Integer;
    local_d0[3] = Div;
    local_d0[4] = Integer;
    local_d0[5] = RParen;
    local_b8 = local_d0;
    local_b0 = 6;
    TokenSequenceValue::TokenSequenceValue(&local_110,"sqrt");
    TokenSequenceValue::TokenSequenceValue(&TStack_100,1);
    TokenSequenceValue::TokenSequenceValue(&TStack_f0,2);
    local_e0 = &local_110;
    local_d8 = 3;
    tokens_16._M_len = local_b0;
    tokens_16._M_array = local_b8;
    values_16._M_len = 3;
    values_16._M_array = local_e0;
    TokenSequenceParser::addEntry(&parseVcstParameter::sequenceParser,3,tokens_16,values_16);
    local_130[0] = Identifier;
    local_130[1] = 5;
    local_130[2] = 4;
    local_130[3] = 6;
    local_120 = local_130;
    local_118 = 4;
    TokenSequenceValue::TokenSequenceValue(&local_160,"sqrt");
    TokenSequenceValue::TokenSequenceValue(&TStack_150,0.5);
    local_140 = &local_160;
    local_138 = 2;
    tokens_15._M_len = local_118;
    tokens_15._M_array = local_120;
    values_15._M_len = 2;
    values_15._M_array = local_140;
    TokenSequenceParser::addEntry(&parseVcstParameter::sequenceParser,3,tokens_15,values_15);
    local_188[0] = Integer;
    local_188[1] = Div;
    local_188[2] = Identifier;
    local_188[3] = LParen;
    local_188[4] = Identifier;
    local_188[5] = RParen;
    local_170 = local_188;
    local_168 = 6;
    TokenSequenceValue::TokenSequenceValue(&local_1c8,2);
    TokenSequenceValue::TokenSequenceValue(&TStack_1b8,"sqrt");
    TokenSequenceValue::TokenSequenceValue(&TStack_1a8,"pi");
    local_198 = &local_1c8;
    local_190 = 3;
    tokens_14._M_len = local_168;
    tokens_14._M_array = local_170;
    values_14._M_len = 3;
    values_14._M_array = local_198;
    TokenSequenceParser::addEntry(&parseVcstParameter::sequenceParser,4,tokens_14,values_14);
    local_1e4[0] = Integer;
    local_1e4[1] = 10;
    local_1e4[2] = 1;
    local_1d8 = local_1e4;
    local_1d0 = 3;
    TokenSequenceValue::TokenSequenceValue(&local_218,2);
    TokenSequenceValue::TokenSequenceValue(&TStack_208,"pi");
    local_1f8 = &local_218;
    local_1f0 = 2;
    tokens_13._M_len = local_1d0;
    tokens_13._M_array = local_1d8;
    values_13._M_len = 2;
    values_13._M_array = local_1f8;
    TokenSequenceParser::addEntry(&parseVcstParameter::sequenceParser,5,tokens_13,values_13);
    local_234[0] = Integer;
    local_234[1] = 10;
    local_234[2] = 1;
    local_228 = local_234;
    local_220 = 3;
    TokenSequenceValue::TokenSequenceValue(&local_268,1);
    TokenSequenceValue::TokenSequenceValue(&TStack_258,"pi");
    local_248 = &local_268;
    local_240 = 2;
    tokens_12._M_len = local_220;
    tokens_12._M_array = local_228;
    values_12._M_len = 2;
    values_12._M_array = local_248;
    TokenSequenceParser::addEntry(&parseVcstParameter::sequenceParser,6,tokens_12,values_12);
    local_284[0] = Identifier;
    local_284[1] = 10;
    local_284[2] = 2;
    local_278 = local_284;
    local_270 = 3;
    TokenSequenceValue::TokenSequenceValue(&local_2b8,"pi");
    TokenSequenceValue::TokenSequenceValue(&TStack_2a8,4);
    local_298 = &local_2b8;
    local_290 = 2;
    tokens_11._M_len = local_270;
    tokens_11._M_array = local_278;
    values_11._M_len = 2;
    values_11._M_array = local_298;
    TokenSequenceParser::addEntry(&parseVcstParameter::sequenceParser,7,tokens_11,values_11);
    local_2d4[0] = Identifier;
    local_2d4[1] = 10;
    local_2d4[2] = 2;
    local_2c8 = local_2d4;
    local_2c0 = 3;
    TokenSequenceValue::TokenSequenceValue(&local_308,"pi");
    TokenSequenceValue::TokenSequenceValue(&TStack_2f8,2);
    local_2e8 = &local_308;
    local_2e0 = 2;
    tokens_10._M_len = local_2c0;
    tokens_10._M_array = local_2c8;
    values_10._M_len = 2;
    values_10._M_array = local_2e8;
    TokenSequenceParser::addEntry(&parseVcstParameter::sequenceParser,8,tokens_10,values_10);
    local_324[0] = Identifier;
    local_324[1] = 10;
    local_324[2] = 2;
    local_318 = local_324;
    local_310 = 3;
    TokenSequenceValue::TokenSequenceValue(&local_358,"pi");
    TokenSequenceValue::TokenSequenceValue(&TStack_348,6);
    local_338 = &local_358;
    local_330 = 2;
    tokens_09._M_len = local_310;
    tokens_09._M_array = local_318;
    values_09._M_len = 2;
    values_09._M_array = local_338;
    TokenSequenceParser::addEntry(&parseVcstParameter::sequenceParser,0x10,tokens_09,values_09);
    local_36c = Identifier;
    local_368 = &local_36c;
    local_360 = 1;
    TokenSequenceValue::TokenSequenceValue(&local_390,"pi");
    local_380 = &local_390;
    local_378 = 1;
    tokens_08._M_len = local_360;
    tokens_08._M_array = local_368;
    values_08._M_len = 1;
    values_08._M_array = local_380;
    TokenSequenceParser::addEntry(&parseVcstParameter::sequenceParser,9,tokens_08,values_08);
    local_3a4 = Identifier;
    local_3a0 = &local_3a4;
    local_398 = 1;
    TokenSequenceValue::TokenSequenceValue(&local_3c8,"e");
    local_3b8 = &local_3c8;
    local_3b0 = 1;
    tokens_07._M_len = local_398;
    tokens_07._M_array = local_3a0;
    values_07._M_len = 1;
    values_07._M_array = local_3b8;
    TokenSequenceParser::addEntry(&parseVcstParameter::sequenceParser,10,tokens_07,values_07);
    local_3e8[0] = Identifier;
    local_3e8[1] = 5;
    local_3e8[2] = 1;
    local_3e8[3] = 6;
    local_3d8 = local_3e8;
    local_3d0 = 4;
    TokenSequenceValue::TokenSequenceValue(&local_418,"log2");
    TokenSequenceValue::TokenSequenceValue(&TStack_408,"e");
    local_3f8 = &local_418;
    local_3f0 = 2;
    tokens_06._M_len = local_3d0;
    tokens_06._M_array = local_3d8;
    values_06._M_len = 2;
    values_06._M_array = local_3f8;
    TokenSequenceParser::addEntry(&parseVcstParameter::sequenceParser,0xb,tokens_06,values_06);
    local_438[0] = Identifier;
    local_438[1] = 5;
    local_438[2] = 1;
    local_438[3] = 6;
    local_428 = local_438;
    local_420 = 4;
    TokenSequenceValue::TokenSequenceValue(&local_468,"log10");
    TokenSequenceValue::TokenSequenceValue(&TStack_458,"e");
    local_448 = &local_468;
    local_440 = 2;
    tokens_05._M_len = local_420;
    tokens_05._M_array = local_428;
    values_05._M_len = 2;
    values_05._M_array = local_448;
    TokenSequenceParser::addEntry(&parseVcstParameter::sequenceParser,0xc,tokens_05,values_05);
    local_488[0] = Identifier;
    local_488[1] = 5;
    local_488[2] = 2;
    local_488[3] = 6;
    local_478 = local_488;
    local_470 = 4;
    TokenSequenceValue::TokenSequenceValue(&local_4b8,"ln");
    TokenSequenceValue::TokenSequenceValue(&TStack_4a8,2);
    local_498 = &local_4b8;
    local_490 = 2;
    tokens_04._M_len = local_470;
    tokens_04._M_array = local_478;
    values_04._M_len = 2;
    values_04._M_array = local_498;
    TokenSequenceParser::addEntry(&parseVcstParameter::sequenceParser,0xd,tokens_04,values_04);
    local_4d8[0] = Identifier;
    local_4d8[1] = 5;
    local_4d8[2] = 2;
    local_4d8[3] = 6;
    local_4c8 = local_4d8;
    local_4c0 = 4;
    TokenSequenceValue::TokenSequenceValue(&local_508,"ln");
    TokenSequenceValue::TokenSequenceValue(&TStack_4f8,10);
    local_4e8 = &local_508;
    local_4e0 = 2;
    tokens_03._M_len = local_4c0;
    tokens_03._M_array = local_4c8;
    values_03._M_len = 2;
    values_03._M_array = local_4e8;
    TokenSequenceParser::addEntry(&parseVcstParameter::sequenceParser,0xe,tokens_03,values_03);
    local_524[0] = Integer;
    local_524[1] = 9;
    local_524[2] = 1;
    local_518 = local_524;
    local_510 = 3;
    TokenSequenceValue::TokenSequenceValue(&local_558,2);
    TokenSequenceValue::TokenSequenceValue(&TStack_548,"pi");
    local_538 = &local_558;
    local_530 = 2;
    tokens_02._M_len = local_510;
    tokens_02._M_array = local_518;
    values_02._M_len = 2;
    values_02._M_array = local_538;
    TokenSequenceParser::addEntry(&parseVcstParameter::sequenceParser,0xf,tokens_02,values_02);
    local_578[0] = Identifier;
    local_578[1] = 5;
    local_578[2] = 2;
    local_578[3] = 6;
    local_568 = local_578;
    local_560 = 4;
    TokenSequenceValue::TokenSequenceValue(&local_5a8,"log10");
    TokenSequenceValue::TokenSequenceValue(&TStack_598,2);
    local_588 = &local_5a8;
    local_580 = 2;
    tokens_01._M_len = local_560;
    tokens_01._M_array = local_568;
    values_01._M_len = 2;
    values_01._M_array = local_588;
    TokenSequenceParser::addEntry(&parseVcstParameter::sequenceParser,0x11,tokens_01,values_01);
    local_5c8[0] = Identifier;
    local_5c8[1] = 5;
    local_5c8[2] = 2;
    local_5c8[3] = 6;
    local_5b8 = local_5c8;
    local_5b0 = 4;
    TokenSequenceValue::TokenSequenceValue(&local_5f8,"log2");
    TokenSequenceValue::TokenSequenceValue(&TStack_5e8,10);
    local_5d8 = &local_5f8;
    local_5d0 = 2;
    tokens_00._M_len = local_5b0;
    tokens_00._M_array = local_5b8;
    values_00._M_len = 2;
    values_00._M_array = local_5d8;
    TokenSequenceParser::addEntry(&parseVcstParameter::sequenceParser,0x12,tokens_00,values_00);
    local_620[0] = Identifier;
    local_620[1] = LParen;
    local_620[2] = Integer;
    local_620[3] = RParen;
    local_620[4] = Div;
    local_620[5] = Integer;
    local_608 = local_620;
    local_600 = 6;
    TokenSequenceValue::TokenSequenceValue(&local_660,"sqrt");
    TokenSequenceValue::TokenSequenceValue(&TStack_650,3);
    TokenSequenceValue::TokenSequenceValue(&TStack_640,2);
    local_630 = &local_660;
    local_628 = 3;
    tokens._M_len = local_600;
    tokens._M_array = local_608;
    values._M_len = 3;
    values._M_array = local_630;
    TokenSequenceParser::addEntry(&parseVcstParameter::sequenceParser,0x13,tokens,values);
  }
  bVar1 = TokenSequenceParser::parse
                    (&parseVcstParameter::sequenceParser,(Parser *)result_local,local_20);
  return bVar1;
}

Assistant:

bool MipsParser::parseVcstParameter(Parser& parser, int& result)
{
	static TokenSequenceParser sequenceParser;

	// initialize on first use
	if (sequenceParser.getEntryCount() == 0)
	{
		// maxfloat
		sequenceParser.addEntry(1,
			{TokenType::Identifier},
			{"maxfloat"}
		);
		// sqrt(2)
		sequenceParser.addEntry(2,
			{TokenType::Identifier, TokenType::LParen, TokenType::Integer, TokenType::RParen},
			{"sqrt", INT64_C(2)}
		);
		// sqrt(1/2)
		sequenceParser.addEntry(3,
			{TokenType::Identifier, TokenType::LParen, TokenType::Integer, TokenType::Div, TokenType::Integer, TokenType::RParen},
			{"sqrt", INT64_C(1), INT64_C(2)}
		);
		// sqrt(0.5)
		sequenceParser.addEntry(3,
			{TokenType::Identifier, TokenType::LParen, TokenType::Float, TokenType::RParen},
			{"sqrt", 0.5}
		);
		// 2/sqrt(pi)
		sequenceParser.addEntry(4,
			{TokenType::Integer, TokenType::Div, TokenType::Identifier, TokenType::LParen, TokenType::Identifier, TokenType::RParen},
			{INT64_C(2), "sqrt", "pi"}
		);
		// 2/pi
		sequenceParser.addEntry(5,
			{TokenType::Integer, TokenType::Div, TokenType::Identifier},
			{INT64_C(2), "pi"}
		);
		// 1/pi
		sequenceParser.addEntry(6,
			{TokenType::Integer, TokenType::Div, TokenType::Identifier},
			{INT64_C(1), "pi"}
		);
		// pi/4
		sequenceParser.addEntry(7,
			{TokenType::Identifier, TokenType::Div, TokenType::Integer},
			{"pi", INT64_C(4)}
		);
		// pi/2
		sequenceParser.addEntry(8,
			{TokenType::Identifier, TokenType::Div, TokenType::Integer},
			{"pi", INT64_C(2)}
		);
		// pi/6 - early because "pi" is a prefix of it
		sequenceParser.addEntry(16,
			{TokenType::Identifier, TokenType::Div, TokenType::Integer},
			{"pi", INT64_C(6)}
		);
		// pi
		sequenceParser.addEntry(9,
			{TokenType::Identifier},
			{"pi"}
		);
		// e
		sequenceParser.addEntry(10,
			{TokenType::Identifier},
			{"e"}
		);
		// log2(e)
		sequenceParser.addEntry(11,
			{TokenType::Identifier, TokenType::LParen, TokenType::Identifier, TokenType::RParen},
			{"log2", "e"}
		);
		// log10(e)
		sequenceParser.addEntry(12,
			{TokenType::Identifier, TokenType::LParen, TokenType::Identifier, TokenType::RParen},
			{"log10", "e"}
		);
		// ln(2)
		sequenceParser.addEntry(13,
			{TokenType::Identifier, TokenType::LParen, TokenType::Integer, TokenType::RParen},
			{"ln", INT64_C(2)}
		);
		// ln(10)
		sequenceParser.addEntry(14,
			{TokenType::Identifier, TokenType::LParen, TokenType::Integer, TokenType::RParen},
			{"ln", INT64_C(10)}
		);
		// 2*pi
		sequenceParser.addEntry(15,
			{TokenType::Integer, TokenType::Mult, TokenType::Identifier},
			{INT64_C(2), "pi"}
		);
		// log10(2)
		sequenceParser.addEntry(17,
			{TokenType::Identifier, TokenType::LParen, TokenType::Integer, TokenType::RParen},
			{"log10", INT64_C(2)}
		);
		// log2(10)
		sequenceParser.addEntry(18,
			{TokenType::Identifier, TokenType::LParen, TokenType::Integer, TokenType::RParen},
			{"log2", INT64_C(10)}
		);
		// sqrt(3)/2
		sequenceParser.addEntry(19,
			{TokenType::Identifier, TokenType::LParen, TokenType::Integer, TokenType::RParen, TokenType::Div, TokenType::Integer},
			{"sqrt", INT64_C(3), INT64_C(2)}
		);
	}

	return sequenceParser.parse(parser,result);
}